

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void * ImFileLoadToMemory(char *filename,char *file_open_mode,size_t *out_file_size,
                         int padding_bytes)

{
  int iVar1;
  FILE *__stream;
  void *ptr;
  void *pvVar2;
  int in_ECX;
  size_t *in_RDX;
  void *file_data;
  size_t file_size;
  long file_size_signed;
  FILE *f;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  void *local_8;
  
  if (in_RDX != (size_t *)0x0) {
    *in_RDX = 0;
  }
  __stream = (FILE *)ImFileOpen(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (__stream == (FILE *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (((iVar1 == 0) && (ptr = (void *)ftell(__stream), ptr != (void *)0xffffffffffffffff)) &&
       (iVar1 = fseek(__stream,0,0), iVar1 == 0)) {
      local_8 = ImGui::MemAlloc((size_t)ptr);
      if (local_8 == (void *)0x0) {
        fclose(__stream);
        local_8 = (void *)0x0;
      }
      else {
        pvVar2 = (void *)fread(local_8,1,(size_t)ptr,__stream);
        if (pvVar2 == ptr) {
          if (0 < in_ECX) {
            memset((void *)((long)local_8 + (long)ptr),0,(long)in_ECX);
          }
          fclose(__stream);
          if (in_RDX != (size_t *)0x0) {
            *in_RDX = (size_t)ptr;
          }
        }
        else {
          fclose(__stream);
          ImGui::MemFree(ptr);
          local_8 = (void *)0x0;
        }
      }
    }
    else {
      fclose(__stream);
      local_8 = (void *)0x0;
    }
  }
  return local_8;
}

Assistant:

void* ImFileLoadToMemory(const char* filename, const char* file_open_mode, size_t* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && file_open_mode);
    if (out_file_size)
        *out_file_size = 0;

    FILE* f;
    if ((f = ImFileOpen(filename, file_open_mode)) == NULL)
        return NULL;

    long file_size_signed;
    if (fseek(f, 0, SEEK_END) || (file_size_signed = ftell(f)) == -1 || fseek(f, 0, SEEK_SET))
    {
        fclose(f);
        return NULL;
    }

    size_t file_size = (size_t)file_size_signed;
    void* file_data = ImGui::MemAlloc(file_size + padding_bytes);
    if (file_data == NULL)
    {
        fclose(f);
        return NULL;
    }
    if (fread(file_data, 1, file_size, f) != file_size)
    {
        fclose(f);
        ImGui::MemFree(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void*)(((char*)file_data) + file_size), 0, (size_t)padding_bytes);

    fclose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}